

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

FString ScriptPresentation(int script)

{
  FString *pFVar1;
  uint in_ESI;
  undefined4 in_register_0000003c;
  FString *this;
  
  this = (FString *)CONCAT44(in_register_0000003c,script);
  FString::FString(this,"script ");
  if (((int)in_ESI < 0) && (-in_ESI < (uint)FName::NameData.NumNames)) {
    pFVar1 = FString::operator+=(this,'\"');
    pFVar1 = FString::operator+=(pFVar1,FName::NameData.NameArray[-in_ESI].Text);
    FString::operator+=(pFVar1,'\"');
  }
  else {
    FString::AppendFormat(this,"%d",(ulong)in_ESI);
  }
  return (FString)(char *)this;
}

Assistant:

static FString ScriptPresentation(int script)
{
	FString out = "script ";

	if (script < 0)
	{
		FName scrname = FName(ENamedName(-script));
		if (scrname.IsValidName())
		{
			out << '"' << scrname.GetChars() << '"';
			return out;
		}
	}
	out.AppendFormat("%d", script);
	return out;
}